

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O3

int x509_get_crt_ext(uchar **p,uchar *end,mbedtls_x509_crt *crt)

{
  int iVar1;
  uchar *puVar2;
  byte *end_00;
  byte *end_01;
  int ext_type;
  int is_critical;
  size_t len;
  mbedtls_x509_buf extn_oid;
  uint local_88;
  int local_84;
  size_t local_80;
  mbedtls_asn1_buf local_78;
  int *local_60;
  int *local_58;
  uint *local_50;
  mbedtls_asn1_sequence *local_48;
  mbedtls_x509_sequence *local_40;
  uchar *local_38;
  
  iVar1 = mbedtls_x509_get_ext(p,end,&crt->v3_ext,3);
  if (iVar1 == -0x62) {
    iVar1 = 0;
  }
  else if (iVar1 == 0) {
    puVar2 = *p;
    if (puVar2 < end) {
      local_38 = &crt->ns_cert_type;
      local_40 = &crt->subject_alt_names;
      local_48 = &crt->ext_key_usage;
      local_50 = &crt->key_usage;
      local_58 = &crt->ca_istrue;
      local_60 = &crt->max_pathlen;
      do {
        local_78.tag = 0;
        local_78._4_4_ = 0;
        local_78.len = 0;
        local_78.p = (uchar *)0x0;
        local_84 = 0;
        local_88 = 0;
        iVar1 = mbedtls_asn1_get_tag(p,end,&local_80,0x30);
        if (iVar1 != 0) {
LAB_0011dde1:
          return iVar1 + -0x2500;
        }
        end_00 = *p + local_80;
        local_78.tag = (uint)**p;
        iVar1 = mbedtls_asn1_get_tag(p,end,&local_78.len,6);
        if (iVar1 != 0) goto LAB_0011dde1;
        local_78.p = *p;
        puVar2 = local_78.p + local_78.len;
        *p = puVar2;
        if (end == puVar2 || (long)end - (long)puVar2 < 0) {
          return -0x2560;
        }
        iVar1 = mbedtls_asn1_get_bool(p,end_00,&local_84);
        if (((iVar1 != -0x62) && (iVar1 != 0)) ||
           (iVar1 = mbedtls_asn1_get_tag(p,end_00,&local_80,4), iVar1 != 0)) goto LAB_0011dde1;
        end_01 = *p + local_80;
        if (end_01 != end_00) {
          return -0x2566;
        }
        iVar1 = mbedtls_oid_get_x509_ext_type(&local_78,(int *)&local_88);
        if (iVar1 == 0) {
          if ((local_88 & crt->ext_types) != 0) {
            return -0x2500;
          }
          crt->ext_types = crt->ext_types | local_88;
          if ((int)local_88 < 0x100) {
            if (local_88 == 4) {
              iVar1 = x509_get_key_usage(p,end_01,local_50);
            }
            else {
              if (local_88 != 0x20) {
                return -0x2080;
              }
              iVar1 = x509_get_subject_alt_name(p,end_01,local_40);
            }
          }
          else if (local_88 == 0x10000) {
            iVar1 = x509_get_ns_cert_type(p,end_01,local_38);
          }
          else if (local_88 == 0x800) {
            iVar1 = mbedtls_asn1_get_sequence_of(p,end_01,local_48,6);
            if (iVar1 == 0) {
              if ((crt->ext_key_usage).buf.p == (uchar *)0x0) {
                return -0x2564;
              }
              goto LAB_0011ddaf;
            }
            iVar1 = iVar1 + -0x2500;
          }
          else {
            if (local_88 != 0x100) {
              return -0x2080;
            }
            iVar1 = x509_get_basic_constraints(p,end_01,local_58,local_60);
          }
          if (iVar1 != 0) {
            return iVar1;
          }
        }
        else {
          *p = end_01;
          if (local_84 != 0) {
            return -0x2562;
          }
        }
LAB_0011ddaf:
        puVar2 = *p;
      } while (puVar2 < end);
    }
    iVar1 = -0x2566;
    if (puVar2 == end) {
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static int x509_get_crt_ext( unsigned char **p,
                             const unsigned char *end,
                             mbedtls_x509_crt *crt )
{
    int ret;
    size_t len;
    unsigned char *end_ext_data, *end_ext_octet;

    if( ( ret = mbedtls_x509_get_ext( p, end, &crt->v3_ext, 3 ) ) != 0 )
    {
        if( ret == MBEDTLS_ERR_ASN1_UNEXPECTED_TAG )
            return( 0 );

        return( ret );
    }

    while( *p < end )
    {
        /*
         * Extension  ::=  SEQUENCE  {
         *      extnID      OBJECT IDENTIFIER,
         *      critical    BOOLEAN DEFAULT FALSE,
         *      extnValue   OCTET STRING  }
         */
        mbedtls_x509_buf extn_oid = {0, 0, NULL};
        int is_critical = 0; /* DEFAULT FALSE */
        int ext_type = 0;

        if( ( ret = mbedtls_asn1_get_tag( p, end, &len,
                MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
            return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS + ret );

        end_ext_data = *p + len;

        /* Get extension ID */
        extn_oid.tag = **p;

        if( ( ret = mbedtls_asn1_get_tag( p, end, &extn_oid.len, MBEDTLS_ASN1_OID ) ) != 0 )
            return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS + ret );

        extn_oid.p = *p;
        *p += extn_oid.len;

        if( ( end - *p ) < 1 )
            return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS +
                    MBEDTLS_ERR_ASN1_OUT_OF_DATA );

        /* Get optional critical */
        if( ( ret = mbedtls_asn1_get_bool( p, end_ext_data, &is_critical ) ) != 0 &&
            ( ret != MBEDTLS_ERR_ASN1_UNEXPECTED_TAG ) )
            return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS + ret );

        /* Data should be octet string type */
        if( ( ret = mbedtls_asn1_get_tag( p, end_ext_data, &len,
                MBEDTLS_ASN1_OCTET_STRING ) ) != 0 )
            return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS + ret );

        end_ext_octet = *p + len;

        if( end_ext_octet != end_ext_data )
            return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS +
                    MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

        /*
         * Detect supported extensions
         */
        ret = mbedtls_oid_get_x509_ext_type( &extn_oid, &ext_type );

        if( ret != 0 )
        {
            /* No parser found, skip extension */
            *p = end_ext_octet;

#if !defined(MBEDTLS_X509_ALLOW_UNSUPPORTED_CRITICAL_EXTENSION)
            if( is_critical )
            {
                /* Data is marked as critical: fail */
                return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS +
                        MBEDTLS_ERR_ASN1_UNEXPECTED_TAG );
            }
#endif
            continue;
        }

        /* Forbid repeated extensions */
        if( ( crt->ext_types & ext_type ) != 0 )
            return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS );

        crt->ext_types |= ext_type;

        switch( ext_type )
        {
        case MBEDTLS_X509_EXT_BASIC_CONSTRAINTS:
            /* Parse basic constraints */
            if( ( ret = x509_get_basic_constraints( p, end_ext_octet,
                    &crt->ca_istrue, &crt->max_pathlen ) ) != 0 )
                return( ret );
            break;

        case MBEDTLS_X509_EXT_KEY_USAGE:
            /* Parse key usage */
            if( ( ret = x509_get_key_usage( p, end_ext_octet,
                    &crt->key_usage ) ) != 0 )
                return( ret );
            break;

        case MBEDTLS_X509_EXT_EXTENDED_KEY_USAGE:
            /* Parse extended key usage */
            if( ( ret = x509_get_ext_key_usage( p, end_ext_octet,
                    &crt->ext_key_usage ) ) != 0 )
                return( ret );
            break;

        case MBEDTLS_X509_EXT_SUBJECT_ALT_NAME:
            /* Parse subject alt name */
            if( ( ret = x509_get_subject_alt_name( p, end_ext_octet,
                    &crt->subject_alt_names ) ) != 0 )
                return( ret );
            break;

        case MBEDTLS_X509_EXT_NS_CERT_TYPE:
            /* Parse netscape certificate type */
            if( ( ret = x509_get_ns_cert_type( p, end_ext_octet,
                    &crt->ns_cert_type ) ) != 0 )
                return( ret );
            break;

        default:
            return( MBEDTLS_ERR_X509_FEATURE_UNAVAILABLE );
        }
    }

    if( *p != end )
        return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

    return( 0 );
}